

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall icu_63::Locale::initBaseName(Locale *this,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int32_t baseNameLength;
  char *eqPtr;
  char *atPtr;
  UErrorCode *status_local;
  Locale *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pcVar3 = strchr(this->fullName,0x40);
    pcVar4 = strchr(this->fullName,0x3d);
    if (((pcVar3 == (char *)0x0) || (pcVar4 == (char *)0x0)) || (pcVar4 <= pcVar3)) {
      this->baseName = this->fullName;
    }
    else {
      iVar2 = (int)pcVar3 - (int)this->fullName;
      pcVar3 = (char *)uprv_malloc_63((long)(iVar2 + 1));
      this->baseName = pcVar3;
      if (this->baseName == (char *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        strncpy(this->baseName,this->fullName,(long)iVar2);
        this->baseName[iVar2] = '\0';
        if (iVar2 < this->variantBegin) {
          this->variantBegin = iVar2;
        }
      }
    }
  }
  return;
}

Assistant:

void
Locale::initBaseName(UErrorCode &status) {
    if (U_FAILURE(status)) {
        return;
    }
    U_ASSERT(baseName==NULL || baseName==fullName);
    const char *atPtr = uprv_strchr(fullName, '@');
    const char *eqPtr = uprv_strchr(fullName, '=');
    if (atPtr && eqPtr && atPtr < eqPtr) {
        // Key words exist.
        int32_t baseNameLength = (int32_t)(atPtr - fullName);
        baseName = (char *)uprv_malloc(baseNameLength + 1);
        if (baseName == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        uprv_strncpy(baseName, fullName, baseNameLength);
        baseName[baseNameLength] = 0;

        // The original computation of variantBegin leaves it equal to the length
        // of fullName if there is no variant.  It should instead be
        // the length of the baseName.
        if (variantBegin > baseNameLength) {
            variantBegin = baseNameLength;
        }
    } else {
        baseName = fullName;
    }
}